

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O2

lzma_stream * stream::init_raw_lzma_stream(lzma_vli filter,lzma_options_lzma *options)

{
  int code;
  lzma_stream *__s;
  lzma_error *this;
  allocator<char> local_69;
  string local_68;
  lzma_filter filters [2];
  
  options->preset_dict = (uint8_t *)0x0;
  __s = (lzma_stream *)operator_new(0x88);
  memset(__s,0,0x88);
  filters[1].id = 0xffffffffffffffff;
  filters[1].options = (void *)0x0;
  filters[0].id = filter;
  filters[0].options = options;
  code = lzma_raw_decoder(__s);
  if (code == 0) {
    return __s;
  }
  operator_delete(__s,0x88);
  this = (lzma_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"inno lzma init error",&local_69);
  lzma_error::lzma_error(this,&local_68,code);
  __cxa_throw(this,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

static lzma_stream * init_raw_lzma_stream(lzma_vli filter, lzma_options_lzma & options) {
	
	options.preset_dict = NULL;
	
	lzma_stream * strm = new lzma_stream;
	lzma_stream tmp = LZMA_STREAM_INIT;
	*strm = tmp;
	strm->allocator = NULL;
	
	const lzma_filter filters[2] = { { filter,  &options }, { LZMA_VLI_UNKNOWN, NULL } };
	lzma_ret ret = lzma_raw_decoder(strm, filters);
	if(ret != LZMA_OK) {
		delete strm;
		throw lzma_error("inno lzma init error", ret);
	}
	
	return strm;
}